

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O3

int fp_list(int argc,long argv)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int stat;
  fitsfile *infptr;
  int hdunum;
  LONGLONG sizell;
  char infits [513];
  char msg [513];
  int in_stack_000006a0;
  int in_stack_000006a4;
  int local_46c;
  fitsfile *local_468;
  undefined4 local_45c;
  long local_458;
  undefined1 local_450 [8];
  char local_448 [512];
  undefined1 local_248;
  char local_238 [520];
  
  local_46c = 0;
  local_458 = argv;
  if (in_stack_000006a4 != 0x2a) {
    pcVar2 = "Error: internal initialization error\n";
LAB_001049ed:
    fp_msg(pcVar2);
LAB_00104a27:
    exit(-1);
  }
  lVar3 = (long)in_stack_000006a0;
  if (in_stack_000006a0 < argc) {
    do {
      strncpy(local_448,*(char **)(local_458 + lVar3 * 8),0x200);
      local_248 = 0;
      pcVar2 = strchr(local_448,0x5b);
      if (pcVar2 != (char *)0x0) {
LAB_001049d0:
        fp_msg("Error: section/extension notation not supported: ");
        fp_msg(local_448);
        pcVar2 = "\n";
        goto LAB_001049ed;
      }
      pcVar2 = strchr(local_448,0x5d);
      if (pcVar2 != (char *)0x0) goto LAB_001049d0;
      iVar1 = fp_access(local_448);
      if (iVar1 != 0) {
        fp_msg("Error: can\'t find or read input file ");
        fp_msg(local_448);
        fp_msg("\n");
        fp_noop();
        goto LAB_00104a27;
      }
      ffopentest(10,&local_468,local_448,0,&local_46c);
      if (local_46c != 0) {
LAB_001049b8:
        ffrprt(_stderr);
        exit(local_46c);
      }
      ffthdu(local_468,&local_45c,&local_46c);
      ffmahd(local_468,local_45c,0,&local_46c);
      ffghadll(local_468,0,0,local_450,&local_46c);
      if (local_46c != 0) {
        fp_abort_output(local_468,(fitsfile *)0x0,local_46c);
      }
      snprintf(local_238,0x201,"# %s (",local_448);
      printf("%s",local_238);
      snprintf(local_238,0x201,"%lld bytes)\n");
      printf("%s",local_238);
      fp_info_hdu(local_468);
      ffclos(local_468,&local_46c);
      if (local_46c != 0) goto LAB_001049b8;
      lVar3 = lVar3 + 1;
    } while (argc != lVar3);
  }
  return 0;
}

Assistant:

int fp_list (int argc, char *argv[], fpstate fpvar)
{
	fitsfile *infptr;
	char	infits[SZ_STR], msg[SZ_STR];
	int	hdunum, iarg, stat=0;
	LONGLONG sizell;

	if (fpvar.initialized != FP_INIT_MAGIC) {
	    fp_msg ("Error: internal initialization error\n"); exit (-1);
	}

	for (iarg=fpvar.firstfile; iarg < argc; iarg++) {
	    strncpy (infits, argv[iarg], SZ_STR-1);
            infits[SZ_STR-1]=0;

	    if (strchr (infits, '[') || strchr (infits, ']')) {
		fp_msg ("Error: section/extension notation not supported: ");
		fp_msg (infits); fp_msg ("\n"); exit (-1);
	    }

	    if (fp_access (infits) != 0) {
		        fp_msg ("Error: can't find or read input file "); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
	    }

	    fits_open_file (&infptr, infits, READONLY, &stat);
	    if (stat) { fits_report_error (stderr, stat); exit (stat); }

	    /* move to the end of file, to get the total size in bytes */
	    fits_get_num_hdus (infptr, &hdunum, &stat);
	    fits_movabs_hdu (infptr, hdunum, NULL, &stat);
	    fits_get_hduaddrll(infptr, NULL, NULL, &sizell, &stat);


	    if (stat) { 
	        fp_abort_output(infptr, NULL, stat);
	    }

            snprintf (msg, SZ_STR,"# %s (", infits); fp_msg (msg);

#if defined(_MSC_VER)
    /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
        snprintf(msg, SZ_STR,"%I64d bytes)\n", sizell); fp_msg (msg);
#elif (USE_LL_SUFFIX == 1)
        snprintf(msg, SZ_STR,"%lld bytes)\n", sizell); fp_msg (msg);
#else
        snprintf(msg, SZ_STR,"%ld bytes)\n", sizell); fp_msg (msg);
#endif
	    fp_info_hdu (infptr);

	    fits_close_file (infptr, &stat);
	    if (stat) { fits_report_error (stderr, stat); exit (stat); }
	}
	return(0);
}